

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O2

PyObject * libxml_xmlRecoverDoc(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 in_RAX;
  xmlDocPtr doc;
  PyObject *pPVar2;
  xmlChar *cur;
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar1 = libxml_deprecationWarning("xmlRecoverDoc");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"z:xmlRecoverDoc",&local_18);
    if (iVar1 != 0) {
      doc = (xmlDocPtr)xmlRecoverDoc(local_18);
      pPVar2 = libxml_xmlDocPtrWrap(doc);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlRecoverDoc(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    xmlChar * cur;

    if (libxml_deprecationWarning("xmlRecoverDoc") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"z:xmlRecoverDoc", &cur))
        return(NULL);

    c_retval = xmlRecoverDoc(cur);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}